

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# castchannel.h
# Opt level: O2

bool __thiscall
CastMessage::on_cls(CastMessage *this,uint32_t field_number,void *pdata,size_t sizedata)

{
  string *psVar1;
  
  switch(field_number) {
  case 2:
    psVar1 = &this->_source_id;
    break;
  case 3:
    psVar1 = &this->_destination_id;
    break;
  case 4:
    psVar1 = &this->_namespace;
    break;
  default:
    printf("Unknown cls field %u\n");
    return false;
  case 6:
    psVar1 = &this->_payload_utf8;
    break;
  case 7:
    std::__cxx11::
    basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>::
    assign(&this->_payload_binary,(uchar *)pdata,sizedata);
    return true;
  }
  std::__cxx11::string::assign((char *)psVar1,(ulong)pdata);
  return true;
}

Assistant:

bool on_cls(uint32_t field_number, const void* pdata, size_t sizedata) override {
        switch(field_number) {
        case id_source_id:
            _source_id.assign((const char*)pdata, sizedata);
            break;
        case id_destination_id:
            _destination_id.assign((const char*)pdata, sizedata);
            break;
        case id_namespace:
            _namespace.assign((const char*)pdata, sizedata);
            break;
        case id_payload_utf8:
            _payload_utf8.assign((const char*)pdata, sizedata);
            break;
        case id_payload_binary:
            _payload_binary.assign((const unsigned char*)pdata, sizedata);
            break;
        default:
            printf("Unknown cls field %u\n", field_number);
            return false;
        }
        return true;
    }